

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  undefined1 auVar17 [16];
  int *piVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  long lVar23;
  undefined2 *puVar24;
  undefined2 *puVar25;
  uint *puVar26;
  undefined4 uVar27;
  undefined2 *puVar28;
  long lVar29;
  int q;
  int i;
  long lVar30;
  long lVar31;
  int k;
  void *pvVar32;
  int k_1;
  undefined2 *puVar33;
  long lVar34;
  ulong uVar35;
  undefined1 local_c8 [64];
  size_t local_88;
  Mat *local_78;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  short tmp [6] [3];
  
  local_88 = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = 0;
  local_c8._24_4_ = 0;
  local_c8._32_8_ = (Allocator *)0x0;
  local_c8._40_4_ = 0;
  local_c8._44_4_ = 0;
  local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar35 = 0;
  local_78 = kernel;
  Mat::create((Mat *)local_c8,0x24,inch,outch,2,(Allocator *)0x0);
  uVar20 = 0;
  if (0 < inch) {
    uVar20 = (ulong)(uint)inch;
  }
  local_70 = 0;
  if (0 < outch) {
    local_70 = (ulong)(uint)outch;
  }
  for (; uVar35 != local_70; uVar35 = uVar35 + 1) {
    iVar19 = inch * 9 * (int)uVar35;
    pvVar14 = local_78->data;
    local_60 = (long)(int)local_c8._44_4_ * local_c8._16_8_;
    pvVar32 = (void *)(local_c8._16_8_ * local_88 * uVar35 + local_c8._0_8_);
    for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
      lVar30 = uVar21 * 9;
      cVar1 = *(char *)((long)pvVar14 + lVar30 + iVar19);
      cVar2 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 1);
      cVar3 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 2);
      cVar4 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 3);
      cVar5 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 4);
      cVar6 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 5);
      cVar7 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 6);
      cVar8 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 7);
      cVar9 = *(char *)((long)pvVar14 + lVar30 + (long)iVar19 + 8);
      for (lVar30 = 4; lVar30 != 0x28; lVar30 = lVar30 + 6) {
        sVar10 = *(short *)(&UNK_004ffeec + lVar30);
        sVar11 = *(short *)(&UNK_004ffeee + lVar30);
        sVar12 = *(short *)((long)&DAT_004ffef0 + lVar30);
        *(short *)((long)tmp[-1] + lVar30 + 2) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
        *(short *)((long)tmp[-1] + lVar30 + 4) = sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
        *(short *)((long)tmp[0] + lVar30) = sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
      }
      pvVar22 = pvVar32;
      for (lVar30 = 0; lVar30 != 6; lVar30 = lVar30 + 1) {
        sVar10 = tmp[lVar30][0];
        uVar13 = *(uint *)(tmp[lVar30] + 1);
        puVar26 = &DAT_004ffef2;
        for (lVar31 = 0; lVar31 != 6; lVar31 = lVar31 + 1) {
          auVar17 = vpmullw_avx(ZEXT416(*puVar26),ZEXT416(uVar13));
          uVar27 = vpextrw_avx(auVar17,1);
          *(short *)((long)pvVar22 + lVar31 * 2) =
               (short)uVar27 + auVar17._0_2_ + *(short *)((long)puVar26 + -2) * sVar10;
          puVar26 = (uint *)((long)puVar26 + 6);
        }
        pvVar22 = (void *)((long)pvVar22 + 0xc);
      }
      pvVar32 = (void *)((long)pvVar32 + local_60);
    }
  }
  local_68 = (ulong)(uint)inch;
  Mat::create(kernel_tm,inch,0x24,(outch / 4) * -3 + outch,8,4,(Allocator *)0x0);
  iVar19 = kernel_tm->w;
  pvVar14 = kernel_tm->data;
  sVar15 = kernel_tm->elemsize;
  sVar16 = kernel_tm->cstep;
  for (uVar20 = 0; (long)(uVar20 | 3) < (long)outch; uVar20 = uVar20 + 4) {
    lVar30 = 0;
    for (lVar31 = 0; lVar31 != 0x24; lVar31 = lVar31 + 1) {
      lVar34 = (long)pvVar14 + (long)iVar19 * sVar15 * lVar31 + (uVar20 >> 2) * sVar16 * sVar15;
      puVar24 = (undefined2 *)(local_88 * local_c8._16_8_ * uVar20 + lVar30 + local_c8._0_8_);
      for (uVar35 = 0; (long)(uVar35 | 7) < (long)inch; uVar35 = uVar35 + 8) {
        puVar28 = puVar24;
        for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
          puVar33 = puVar28;
          for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 2) {
            *(undefined2 *)(lVar34 + lVar23) = *puVar33;
            puVar33 = (undefined2 *)((long)puVar33 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
          }
          puVar28 = (undefined2 *)((long)puVar28 + local_88 * local_c8._16_8_);
          lVar34 = lVar34 + 0x10;
        }
        puVar24 = puVar24 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
      }
      lVar30 = lVar30 + 2;
    }
  }
  iVar19 = kernel_tm->w;
  pvVar14 = kernel_tm->data;
  sVar15 = kernel_tm->elemsize;
  sVar16 = kernel_tm->cstep;
  puVar24 = (undefined2 *)(local_c8._16_8_ * local_88 * uVar20 + local_c8._0_8_);
  for (; (long)uVar20 < (long)outch; uVar20 = uVar20 + 1) {
    puVar28 = puVar24;
    for (lVar30 = 0; lVar30 != 0x24; lVar30 = lVar30 + 1) {
      lVar31 = (long)pvVar14 +
               (long)iVar19 * sVar15 * lVar30 +
               (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) * sVar16 * sVar15;
      puVar33 = puVar28;
      for (uVar35 = 0; (long)(uVar35 | 7) < (long)inch; uVar35 = uVar35 + 8) {
        puVar25 = puVar33;
        for (lVar34 = 0; lVar34 != 0x10; lVar34 = lVar34 + 2) {
          *(undefined2 *)(lVar31 + lVar34) = *puVar25;
          puVar25 = (undefined2 *)((long)puVar25 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
        }
        puVar33 = puVar33 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
        lVar31 = lVar31 + 0x10;
      }
      puVar28 = puVar28 + 1;
    }
    puVar24 = (undefined2 *)((long)puVar24 + local_c8._16_8_ * local_88);
  }
  piVar18 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}